

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_BtreeMultisetEmplaceHint_Test::TestBody
          (Btree_BtreeMultisetEmplaceHint_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar1;
  iterator iVar2;
  int value_to_insert;
  btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_> s;
  undefined1 local_70 [8];
  uint local_68;
  undefined4 uStack_64;
  AssertHelper local_60;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  local_58;
  undefined1 local_48 [8];
  int local_40;
  undefined4 uStack_3c;
  int local_34;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  local_30;
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_> local_20;
  
  local_34 = 0x1e240;
  local_20.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>_*>
        )&btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
          EmptyNode()::empty_node;
  local_20.rightmost_ =
       (node_type *)
       &btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>::
        EmptyNode()::empty_node;
  local_20.size_ = 0;
  local_48._0_4_ = 0x1e240;
  iVar2 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
          insert_multi<int>(&local_20,(key_type *)local_48,(int *)local_48);
  local_30.node = iVar2.node;
  local_30.position = iVar2.position;
  if (((ulong)local_20.rightmost_ & 7) != 0) {
LAB_001b9ba5:
    pcVar1 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
LAB_001b9bd1:
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,pcVar1);
  }
  local_70 = (undefined1  [8])local_20.rightmost_;
  local_68 = (uint)(byte)*(node_type *)((long)local_20.rightmost_ + 10);
  testing::internal::
  CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>>
            ((internal *)local_48,"iter","s.end()",&local_30,
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
              *)local_70);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_70);
    if ((undefined8 *)CONCAT44(uStack_3c,local_40) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT44(uStack_3c,local_40);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x62a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_70 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(long *)local_70 + 8))();
    }
    __ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_3c,local_40);
    if (__ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001b9b95;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_40;
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_3c,local_40) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_3c,local_40));
    }
    if (((ulong)local_30.node & 7) != 0) {
LAB_001b9bbc:
      pcVar1 = 
      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
      ;
      goto LAB_001b9bd1;
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_48,"*iter","value_to_insert",
               (int *)(local_30.node + (long)local_30.position * 4 + 0xc),&local_34);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_70);
      if ((undefined8 *)CONCAT44(uStack_3c,local_40) == (undefined8 *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)CONCAT44(uStack_3c,local_40);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x62b,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_70 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_3c,local_40) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_3c,local_40));
    }
    iVar2.position = local_30.position;
    iVar2.node = local_30.node;
    local_70._0_4_ = local_34;
    iVar2._12_4_ = 0;
    iVar2 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
            insert_hint_multi<int>(&local_20,iVar2,(int *)local_70);
    local_48 = (undefined1  [8])iVar2.node;
    local_40 = iVar2.position;
    testing::internal::
    CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>>
              ((internal *)local_70,"emplace_iter","iter",
               (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                *)local_48,&local_30);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if ((undefined8 *)CONCAT44(uStack_64,local_68) == (undefined8 *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)CONCAT44(uStack_64,local_68);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x62d,pcVar1);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_58.node != (node_type *)0x0) {
        (**(code **)(*(long *)local_58.node + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_64,local_68) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_64,local_68));
    }
    if (((ulong)local_20.rightmost_ & 7) != 0) goto LAB_001b9ba5;
    local_58.node = local_20.rightmost_;
    local_58.position = (int)(byte)*(node_type *)((long)local_20.rightmost_ + 10);
    testing::internal::
    CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>>
              ((internal *)local_70,"emplace_iter","s.end()",
               (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                *)local_48,&local_58);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if ((undefined8 *)CONCAT44(uStack_64,local_68) == (undefined8 *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)CONCAT44(uStack_64,local_68);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x62e,pcVar1);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
LAB_001b9b67:
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_58.node != (node_type *)0x0) {
        (**(code **)(*(long *)local_58.node + 8))();
      }
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_64,local_68) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_64,local_68));
      }
      if (((ulong)local_48 & 7) != 0) goto LAB_001b9bbc;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_70,"*emplace_iter","value_to_insert",
                 (int *)((long)local_48 + (long)local_40 * 4 + 0xc),&local_34);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if ((undefined8 *)CONCAT44(uStack_64,local_68) == (undefined8 *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)CONCAT44(uStack_64,local_68);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x62f,pcVar1);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
        goto LAB_001b9b67;
      }
    }
    __ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_64,local_68);
    if (__ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001b9b95;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_68;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr);
LAB_001b9b95:
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::~btree
            (&local_20);
  return;
}

Assistant:

TEST(Btree, BtreeMultisetEmplaceHint) {
        const int value_to_insert = 123456;
        phmap::btree_multiset<int> s;
        auto iter = s.emplace(value_to_insert);
        ASSERT_NE(iter, s.end());
        EXPECT_EQ(*iter, value_to_insert);
        auto emplace_iter = s.emplace_hint(iter, value_to_insert);
        EXPECT_NE(emplace_iter, iter);
        ASSERT_NE(emplace_iter, s.end());
        EXPECT_EQ(*emplace_iter, value_to_insert);
    }